

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_poly.c
# Opt level: O2

mpt_value * iterPolyValue(mpt_iterator *it)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  _mpt_vptr_iterator *p_Var5;
  _mpt_vptr_iterator *p_Var6;
  _mpt_vptr_iterator *p_Var7;
  
  p_Var5 = it[4]._vptr;
  if (p_Var5 == (_mpt_vptr_iterator *)0x0) {
    if (0xfffffffe < (long)it[5]._vptr) {
      return (mpt_value *)0x0;
    }
    p_Var5 = (_mpt_vptr_iterator *)(double)(long)it[5]._vptr;
  }
  else {
    if ((long)((ulong)p_Var5[1].value >> 3) <= (long)it[5]._vptr) {
      return (mpt_value *)0x0;
    }
    p_Var5 = (_mpt_vptr_iterator *)(&p_Var5[1].advance)[(long)it[5]._vptr];
  }
  if (it[2]._vptr != (_mpt_vptr_iterator *)0x0) {
    return (mpt_value *)(it + 1);
  }
  uVar1 = *(uint *)&it[6]._vptr;
  p_Var6 = p_Var5;
  if (uVar1 != 0) {
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    p_Var6 = (_mpt_vptr_iterator *)0x0;
    uVar2 = 0;
    while (uVar2 != uVar3) {
      p_Var7 = it[uVar2 * 2 + 8]._vptr;
      for (uVar4 = uVar2 + 1 & 0xffffffff; (int)uVar4 < (int)uVar1; uVar4 = (ulong)((int)uVar4 + 1))
      {
        p_Var7 = (_mpt_vptr_iterator *)
                 ((double)p_Var7 * ((double)it[uVar2 * 2 + 7]._vptr + (double)p_Var5));
      }
      p_Var6 = (_mpt_vptr_iterator *)((double)p_Var6 + (double)p_Var7);
      uVar2 = uVar2 + 1;
    }
  }
  it[3]._vptr = p_Var6;
  it[1]._vptr = (_mpt_vptr_iterator *)(it + 3);
  it[2]._vptr = (_mpt_vptr_iterator *)0x64;
  return (mpt_value *)(it + 1);
}

Assistant:

static const MPT_STRUCT(value) *iterPolyValue(MPT_INTERFACE(iterator) *it)
{
	MPT_STRUCT(iteratorPolynom) *d = MPT_baseaddr(iteratorPolynom, it, _it);
	MPT_STRUCT(buffer) *buf;
	double sum, val;
	long max, j;
	
	/* check limits and set initial value */
	if ((buf = d->grid._buf)) {
		const double *src = (void *) (buf + 1);
		max = buf->_used / sizeof(double);
		if (d->pos >= max) {
			return 0;
		}
		val = src[d->pos];
	}
	else if (d->pos >= UINT_MAX) {
		return 0;
	}
	else {
		val = d->pos;
	}
	/* reuse calculations of previous call */
	if (d->val._type) {
		return &d->val;
	}
	/* no coefficients */
	if (!(max = d->coeff)) {
		sum = val;
	}
	/* calculate polynom */
	else {
		const struct coeff_poly *coeff = (void *) (d + 1);
		for (j = 0, sum = 0.0; j < max; j++) {
			double prod, tmp = val;
			int k;
			
			tmp += coeff[j].shift;
			
			for (k = j + 1, prod = coeff[j].mult; k < max; k++) {
				prod *= tmp;
			}
			sum += prod;
		}
	}
	/* assign new value */
	d->curr = sum;
	MPT_value_set(&d->val, 'd', &d->curr);
	
	return &d->val;
}